

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O2

AdbcStatusCode AdbcConnectionNew(AdbcConnection *connection,AdbcError *error)

{
  TempConnection *this;
  
  this = (TempConnection *)operator_new(0xe0);
  TempConnection::TempConnection(this);
  connection->private_data = this;
  connection->private_driver = (AdbcDriver *)0x0;
  return '\0';
}

Assistant:

AdbcStatusCode AdbcConnectionNew(struct AdbcConnection *connection, struct AdbcError *error) {
	// Allocate a temporary structure to store options pre-Init, because
	// we don't get access to the database (and hence the driver
	// function table) until then
	connection->private_data = new TempConnection;
	connection->private_driver = nullptr;
	return ADBC_STATUS_OK;
}